

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O0

void If_CutSort(If_Man_t *p,If_Set_t *pCutSet,If_Cut_t *pCut)

{
  If_Cut_t *pC0;
  int iVar1;
  int iVar2;
  If_Cut_t *pFirst;
  int i;
  If_Cut_t *pCut_local;
  If_Set_t *pCutSet_local;
  If_Man_t *p_local;
  
  if (pCutSet->ppCuts[pCutSet->nCuts] != pCut) {
    __assert_fail("pCutSet->ppCuts[pCutSet->nCuts] == pCut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                  ,0x2e8,"void If_CutSort(If_Man_t *, If_Set_t *, If_Cut_t *)");
  }
  if (pCutSet->nCuts <= pCutSet->nCutsMax) {
    if (pCutSet->nCuts == 0) {
      pCutSet->nCuts = pCutSet->nCuts + 1;
    }
    else if ((((*(uint *)&pCut->field_0x1c >> 0xe & 1) == 0) &&
             (((((((p->pPars->fUseDsd != 0 ||
                   (p->pPars->pFuncCell2 !=
                    (_func_int_If_Man_t_ptr_word_ptr_int_Vec_Str_t_ptr_char_ptr_ptr *)0x0)) ||
                  (p->pPars->fUseBat != 0)) ||
                 ((p->pPars->pLutStruct != (char *)0x0 || (p->pPars->fUserRecLib != 0)))) ||
                ((p->pPars->fUserSesLib != 0 ||
                 ((p->pPars->fEnableCheck07 != 0 || (p->pPars->fUseCofVars != 0)))))) ||
               (p->pPars->fUseAndVars != 0)) ||
              ((((p->pPars->fUse34Spec != 0 || (p->pPars->fUseDsdTune != 0)) ||
                (p->pPars->fEnableCheck75 != 0)) || (p->pPars->fEnableCheck75u != 0)))))) &&
            ((pC0 = *pCutSet->ppCuts, (*(uint *)&pC0->field_0x1c >> 0xe & 1) != 0 ||
             (iVar1 = If_ManSortCompare(p,pC0,pCut), iVar1 == 1)))) {
      *pCutSet->ppCuts = pCut;
      pCutSet->ppCuts[pCutSet->nCuts] = pC0;
      If_CutSort(p,pCutSet,pC0);
    }
    else {
      iVar1 = (int)pCutSet->nCuts;
      while (((pFirst._4_4_ = iVar1 + -1, -1 < pFirst._4_4_ &&
              (iVar2 = If_ManSortCompare(p,pCutSet->ppCuts[pFirst._4_4_],pCut), 0 < iVar2)) &&
             ((pFirst._4_4_ != 0 ||
              (((*(uint *)&(*pCutSet->ppCuts)->field_0x1c >> 0xe & 1) != 0 ||
               ((*(uint *)&pCut->field_0x1c >> 0xe & 1) == 0))))))) {
        pCutSet->ppCuts[iVar1] = pCutSet->ppCuts[pFirst._4_4_];
        pCutSet->ppCuts[pFirst._4_4_] = pCut;
        iVar1 = pFirst._4_4_;
      }
      if (pCutSet->nCuts < pCutSet->nCutsMax) {
        pCutSet->nCuts = pCutSet->nCuts + 1;
      }
    }
    return;
  }
  __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                ,0x2e9,"void If_CutSort(If_Man_t *, If_Set_t *, If_Cut_t *)");
}

Assistant:

void If_CutSort( If_Man_t * p, If_Set_t * pCutSet, If_Cut_t * pCut )
{
//    int Counter = 0;
    int i;

    // the new cut is the last one
    assert( pCutSet->ppCuts[pCutSet->nCuts] == pCut );
    assert( pCutSet->nCuts <= pCutSet->nCutsMax );

    // cut structure is empty
    if ( pCutSet->nCuts == 0 )
    {
        pCutSet->nCuts++;
        return;
    }

    if ( !pCut->fUseless && 
         (p->pPars->fUseDsd || p->pPars->pFuncCell2 || p->pPars->fUseBat || 
          p->pPars->pLutStruct || p->pPars->fUserRecLib || p->pPars->fUserSesLib || 
          p->pPars->fEnableCheck07 || p->pPars->fUseCofVars || p->pPars->fUseAndVars || p->pPars->fUse34Spec || 
          p->pPars->fUseDsdTune || p->pPars->fEnableCheck75 || p->pPars->fEnableCheck75u) )
    {
        If_Cut_t * pFirst = pCutSet->ppCuts[0];
        if ( pFirst->fUseless || If_ManSortCompare(p, pFirst, pCut) == 1 )
        {
            pCutSet->ppCuts[0] = pCut;
            pCutSet->ppCuts[pCutSet->nCuts] = pFirst;
            If_CutSort( p, pCutSet, pFirst );
            return;
        }
    }

    // the cut will be added - find its place
    for ( i = pCutSet->nCuts-1; i >= 0; i-- )
    {
//        Counter++;
        if ( If_ManSortCompare( p, pCutSet->ppCuts[i], pCut ) <= 0 || (i == 0 && !pCutSet->ppCuts[0]->fUseless && pCut->fUseless) )
            break;
        pCutSet->ppCuts[i+1] = pCutSet->ppCuts[i];
        pCutSet->ppCuts[i] = pCut;
    }
//    Abc_Print( 1, "%d ", Counter );

    // update the number of cuts
    if ( pCutSet->nCuts < pCutSet->nCutsMax )
        pCutSet->nCuts++;
}